

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btreeblock.cc
# Opt level: O0

int btreeblk_is_writable(void *voidhandle,bid_t bid)

{
  int iVar1;
  bid_t in_RSI;
  filemgr *in_RDI;
  size_t idx;
  size_t sb;
  bid_t filebid;
  bid_t _bid;
  btreeblk_handle *handle;
  size_t local_38 [2];
  ulong local_28;
  ulong in_stack_ffffffffffffffe0;
  
  local_38[0] = 0;
  local_38[1] = 0;
  subbid2bid(in_RSI,local_38 + 1,local_38,(bid_t *)&stack0xffffffffffffffe0);
  local_28 = in_stack_ffffffffffffffe0 / *(ushort *)((long)&in_RDI->filename + 4);
  iVar1 = filemgr_is_writable(in_RDI,in_stack_ffffffffffffffe0);
  return iVar1;
}

Assistant:

int btreeblk_is_writable(void *voidhandle, bid_t bid)
{
    struct btreeblk_handle *handle = (struct btreeblk_handle *)voidhandle;
    bid_t _bid;
    bid_t filebid;
    size_t sb, idx;

    sb = idx = 0;
    subbid2bid(bid, &sb, &idx, &_bid);
    filebid = _bid / handle->nnodeperblock;

    return filemgr_is_writable(handle->file, filebid);
}